

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

int __thiscall cmake::HandleDeleteCacheVariables(cmake *this,string *var)

{
  bool bVar1;
  pointer pcVar2;
  ostream *poVar3;
  reference pbVar4;
  string *psVar5;
  reference key;
  char *helpString;
  string local_310;
  reference local_2f0;
  SaveCacheEntry *i_1;
  iterator __end1;
  iterator __begin1;
  vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_> *__range1;
  string local_2c8;
  cmValue local_2a8;
  cmValue help;
  cmValue existingValue;
  undefined1 local_288 [8];
  SaveCacheEntry save;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_218;
  iterator i;
  ostringstream warning;
  undefined1 local_98 [8];
  vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_> saved;
  allocator<char> local_69;
  string local_68;
  string_view local_48;
  undefined1 local_38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  argsSplit;
  string *var_local;
  cmake *this_local;
  
  argsSplit.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = var;
  local_48 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)var);
  cmExpandedList_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_38,local_48,true);
  pcVar2 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"__CMAKE_DELETE_CACHE_CHANGE_VARS_",&local_69);
  cmState::SetGlobalProperty(pcVar2,&local_68,"");
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  bVar1 = GetIsInTryCompile(this);
  if (bVar1) {
    this_local._4_4_ = 0;
    saved.super__Vector_base<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  }
  else {
    std::vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>::vector
              ((vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_> *)local_98);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&i);
    poVar3 = std::operator<<((ostream *)&i,
                             "You have changed variables that require your cache to be deleted.\n");
    poVar3 = std::operator<<(poVar3,
                             "Configure will be re-run and you may have to reset some variables.\n")
    ;
    std::operator<<(poVar3,"The following variables have changed:\n");
    local_218._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_38);
    while( true ) {
      save._96_8_ = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_38);
      bVar1 = __gnu_cxx::operator!=
                        (&local_218,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&save.type);
      if (!bVar1) break;
      SaveCacheEntry::SaveCacheEntry((SaveCacheEntry *)local_288);
      pbVar4 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_218);
      std::__cxx11::string::operator=((string *)local_288,(string *)pbVar4);
      pbVar4 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_218);
      poVar3 = std::operator<<((ostream *)&i,(string *)pbVar4);
      std::operator<<(poVar3,"= ");
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_218,0);
      existingValue.Value =
           (string *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_38);
      bVar1 = __gnu_cxx::operator!=
                        (&local_218,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&existingValue);
      if (bVar1) {
        pbVar4 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_218);
        std::__cxx11::string::operator=
                  ((string *)(save.key.field_2._M_local_buf + 8),(string *)pbVar4);
        pbVar4 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_218);
        poVar3 = std::operator<<((ostream *)&i,(string *)pbVar4);
        std::operator<<(poVar3,"\n");
      }
      else {
        std::operator<<((ostream *)&i,"\n");
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator-=(&local_218,1);
      }
      pcVar2 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
      help = cmState::GetCacheEntryValue(pcVar2,(string *)local_288);
      bVar1 = cmValue::operator_cast_to_bool(&help);
      if (bVar1) {
        pcVar2 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
        save.help.field_2._8_4_ = cmState::GetCacheEntryType(pcVar2,(string *)local_288);
        pcVar2 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2c8,"HELPSTRING",(allocator<char> *)((long)&__range1 + 7));
        local_2a8 = cmState::GetCacheEntryProperty(pcVar2,(string *)local_288,&local_2c8);
        std::__cxx11::string::~string((string *)&local_2c8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
        bVar1 = cmValue::operator_cast_to_bool(&local_2a8);
        if (bVar1) {
          psVar5 = cmValue::operator*[abi_cxx11_(&local_2a8);
          std::__cxx11::string::operator=
                    ((string *)(save.value.field_2._M_local_buf + 8),(string *)psVar5);
        }
      }
      else {
        save.help.field_2._8_4_ = 6;
      }
      std::vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>::push_back
                ((vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_> *)local_98,
                 (value_type *)local_288);
      SaveCacheEntry::~SaveCacheEntry((SaveCacheEntry *)local_288);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_218);
    }
    psVar5 = GetHomeOutputDirectory_abi_cxx11_(this);
    DeleteCache(this,psVar5);
    LoadCache(this);
    __end1 = std::vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>::begin
                       ((vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_> *)local_98);
    i_1 = (SaveCacheEntry *)
          std::vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>::end
                    ((vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_> *)local_98);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<SaveCacheEntry_*,_std::vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>_>
                                  *)&i_1);
      if (!bVar1) break;
      key = __gnu_cxx::
            __normal_iterator<SaveCacheEntry_*,_std::vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>_>
            ::operator*(&__end1);
      local_2f0 = key;
      helpString = (char *)std::__cxx11::string::c_str();
      AddCacheEntry(this,&key->key,&key->value,helpString,local_2f0->type);
      __gnu_cxx::
      __normal_iterator<SaveCacheEntry_*,_std::vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>_>
      ::operator++(&__end1);
    }
    std::__cxx11::ostringstream::str();
    cmSystemTools::Message(&local_310,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_310);
    bVar1 = cmSystemTools::GetErrorOccurredFlag();
    if (bVar1) {
      this_local._4_4_ = 0;
    }
    else {
      this_local._4_4_ = Configure(this);
    }
    saved.super__Vector_base<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&i);
    std::vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>::~vector
              ((vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_> *)local_98);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_38);
  return this_local._4_4_;
}

Assistant:

int cmake::HandleDeleteCacheVariables(const std::string& var)
{
  std::vector<std::string> argsSplit = cmExpandedList(var, true);
  // erase the property to avoid infinite recursion
  this->State->SetGlobalProperty("__CMAKE_DELETE_CACHE_CHANGE_VARS_", "");
  if (this->GetIsInTryCompile()) {
    return 0;
  }
  std::vector<SaveCacheEntry> saved;
  std::ostringstream warning;
  /* clang-format off */
  warning
    << "You have changed variables that require your cache to be deleted.\n"
    << "Configure will be re-run and you may have to reset some variables.\n"
    << "The following variables have changed:\n";
  /* clang-format on */
  for (auto i = argsSplit.begin(); i != argsSplit.end(); ++i) {
    SaveCacheEntry save;
    save.key = *i;
    warning << *i << "= ";
    i++;
    if (i != argsSplit.end()) {
      save.value = *i;
      warning << *i << "\n";
    } else {
      warning << "\n";
      i -= 1;
    }
    cmValue existingValue = this->State->GetCacheEntryValue(save.key);
    if (existingValue) {
      save.type = this->State->GetCacheEntryType(save.key);
      if (cmValue help =
            this->State->GetCacheEntryProperty(save.key, "HELPSTRING")) {
        save.help = *help;
      }
    } else {
      save.type = cmStateEnums::CacheEntryType::UNINITIALIZED;
    }
    saved.push_back(std::move(save));
  }

  // remove the cache
  this->DeleteCache(this->GetHomeOutputDirectory());
  // load the empty cache
  this->LoadCache();
  // restore the changed compilers
  for (SaveCacheEntry const& i : saved) {
    this->AddCacheEntry(i.key, i.value, i.help.c_str(), i.type);
  }
  cmSystemTools::Message(warning.str());
  // avoid reconfigure if there were errors
  if (!cmSystemTools::GetErrorOccurredFlag()) {
    // re-run configure
    return this->Configure();
  }
  return 0;
}